

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Reader.hh
# Opt level: O2

void __thiscall
avro::ReaderImpl<avro::Validator>::readValue(ReaderImpl<avro::Validator> *this,double *val)

{
  anon_union_8_2_94730066 v;
  
  Validator::checkTypeExpected(&this->validator_,AVRO_DOUBLE);
  BufferReader::read<unsigned_long>(&this->reader_,&v.i);
  *val = (double)v;
  return;
}

Assistant:

void readValue(double &val) {
        validator_.checkTypeExpected(AVRO_DOUBLE);
        union { 
            double d;
            uint64_t i;
        } v;
        reader_.read(v.i);
        val = v.d;
    }